

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Di<(moira::Mode)5,_4> wrapper)

{
  An an;
  An an_00;
  char *str;
  
  switch(this->style->syntax) {
  case MOIRA:
  case MUSASHI:
    operator<<(this,"(");
    operator<<(this,(Int)(int)(short)(wrapper.ea)->ext1);
    str = ",";
    break;
  case MOIRA_MIT:
  case GNU_MIT:
    an.raw._2_2_ = 0;
    an.raw._0_2_ = (wrapper.ea)->reg;
    operator<<(this,an);
    operator<<(this,"@(");
    operator<<(this,(Int)(int)(short)(wrapper.ea)->ext1);
    goto LAB_0021c1d3;
  case GNU:
    operator<<(this,(Int)(int)(short)(wrapper.ea)->ext1);
    str = "(";
    break;
  default:
    goto switchD_0021c158_default;
  }
  operator<<(this,str);
  an_00.raw._2_2_ = 0;
  an_00.raw._0_2_ = (wrapper.ea)->reg;
  operator<<(this,an_00);
LAB_0021c1d3:
  operator<<(this,")");
switchD_0021c158_default:
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Di<M, S> wrapper)
{
    auto &ea = wrapper.ea;

    switch (style.syntax) {

        case Syntax::MOIRA:
        case Syntax::MUSASHI:

            *this << "(" << Int{(i16)ea.ext1} << "," << An{ea.reg} << ")";
            return *this;

       case Syntax::GNU:

            *this << Int{(i16)ea.ext1} << "(" << An{ea.reg} << ")";
            break;

        case Syntax::GNU_MIT:
        case Syntax::MOIRA_MIT:

            *this << An{ea.reg} << "@(" << Int{(i16)ea.ext1} << ")";
            break;
    }

    return *this;
}